

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O3

void __thiscall
gss::innards::Proof::colour_bound
          (Proof *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *ccs)

{
  long *plVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  uVar5;
  ulong *puVar6;
  pointer ppVar7;
  pointer plVar8;
  pointer ppVar9;
  const_iterator cVar10;
  mapped_type *pmVar11;
  ostream *poVar12;
  mapped_type_conflict *pmVar13;
  pointer piVar14;
  _Base_ptr p_Var15;
  _Rb_tree_node_base *p_Var16;
  pointer piVar17;
  ulong uVar18;
  int *piVar19;
  pointer pvVar20;
  _Base_ptr p_Var21;
  vector<int,_std::allocator<int>_> *cc;
  long lVar22;
  pointer pvVar23;
  _Base_ptr p_Var24;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var25;
  uint uVar26;
  ulong uVar27;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__x;
  int *c;
  int *piVar28;
  pointer ppVar29;
  int *piVar30;
  pointer plVar31;
  vector<long,_std::allocator<long>_> to_sum;
  vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  bigger_cc;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range2_1;
  vector<long,_std::allocator<long>_> local_e8;
  int *local_c8;
  pointer local_c0;
  vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_b8;
  undefined1 local_98 [8];
  _Alloc_hider _Stack_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_40;
  pointer local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t,"* bound, ccs",0xc);
  pvVar20 = (ccs->
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_40 = ccs;
  for (pvVar23 = (ccs->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pvVar23 != pvVar20;
      pvVar23 = pvVar23 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               (((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
               proof_stream)._M_t," [",2);
    piVar19 = (pvVar23->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    for (piVar30 = (pvVar23->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start; piVar30 != piVar19; piVar30 = piVar30 + 1) {
      uVar5._M_t.
      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl = (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     proof_stream)._M_t;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 uVar5._M_t.
                 super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
                 _M_head_impl," ",1);
      std::ostream::operator<<
                ((ostream *)
                 uVar5._M_t.
                 super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
                 _M_head_impl,*piVar30);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               (((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
               proof_stream)._M_t," ]",2);
  }
  local_98[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t,local_98,1);
  _Var25._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  if (((_Var25._M_head_impl)->recover_encoding != false) &&
     ((_Var25._M_head_impl)->doing_hom_colour_proof == false)) {
    pvVar20 = (local_40->
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_38 = (local_40->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar20 != local_38) {
      do {
        piVar17 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        piVar14 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if ((long)piVar17 - (long)piVar14 != 4 && piVar17 != piVar14) {
          uVar26 = 2;
          piVar30 = (int *)0x0;
          do {
            piVar28 = (int *)(ulong)((int)piVar30 + 1);
            local_c0 = (pointer)CONCAT44(local_c0._4_4_,uVar26);
            piVar19 = (int *)((long)piVar17 - (long)piVar14 >> 2);
            local_c8 = piVar28;
            if (piVar28 < piVar19) {
              do {
                _Var25._M_head_impl =
                     (this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
                _Stack_90._M_p = (pointer)(long)piVar14[(long)piVar28];
                local_98 = (undefined1  [8])(long)piVar14[(long)piVar30];
                cVar10 = std::
                         _Rb_tree<std::pair<long,_long>,_std::pair<const_std::pair<long,_long>,_long>,_std::_Select1st<std::pair<const_std::pair<long,_long>,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
                         ::find(&((_Var25._M_head_impl)->non_edge_constraints)._M_t,
                                (key_type *)local_98);
                if (cVar10._M_node ==
                    (_Base_ptr)((long)&(_Var25._M_head_impl)->non_edge_constraints + 8U)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)
                             (((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                              _M_head_impl)->proof_stream)._M_t,"# 0\n",4);
                  uVar5._M_t.
                  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                  ._M_head_impl =
                       (((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                       proof_stream)._M_t;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)
                             uVar5._M_t.
                             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                             ._M_head_impl,"ea -1 x",7);
                  local_98 = (undefined1  [8])
                             (long)(pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start[(long)piVar30];
                  pmVar11 = std::
                            map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](&((this->_imp)._M_t.
                                           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>
                                          ._M_head_impl)->binary_variable_mappings,
                                         (key_type_conflict1 *)local_98);
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)
                                       uVar5._M_t.
                                       super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                       ._M_head_impl,(pmVar11->_M_dataplus)._M_p,
                                       pmVar11->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12," -1 x",5);
                  local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       (pointer)(long)(pvVar20->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_start[(long)piVar28];
                  pmVar11 = std::
                            map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](&((this->_imp)._M_t.
                                           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>
                                          ._M_head_impl)->binary_variable_mappings,
                                         (key_type_conflict1 *)&local_e8);
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar12,(pmVar11->_M_dataplus)._M_p,pmVar11->_M_string_length
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12," >= -1 ;\n",9);
                  _Var25._M_head_impl =
                       (this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
                  lVar22 = (_Var25._M_head_impl)->proof_line + 1;
                  (_Var25._M_head_impl)->proof_line = lVar22;
                  piVar17 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start;
                  local_98 = (undefined1  [8])(long)piVar17[(long)piVar30];
                  _Stack_90._M_p = (pointer)(long)piVar17[(long)piVar28];
                  pmVar13 = std::
                            map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
                            ::operator[](&(_Var25._M_head_impl)->non_edge_constraints,
                                         (key_type *)local_98);
                  *pmVar13 = lVar22;
                  piVar17 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start;
                  _Stack_90._M_p = (pointer)(long)piVar17[(long)piVar30];
                  local_98 = (undefined1  [8])(long)piVar17[(long)piVar28];
                  pmVar13 = std::
                            map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
                            ::operator[](&((this->_imp)._M_t.
                                           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>
                                          ._M_head_impl)->non_edge_constraints,(key_type *)local_98)
                  ;
                  *pmVar13 = lVar22;
                  uVar5._M_t.
                  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                  ._M_head_impl =
                       (((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                       proof_stream)._M_t;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)
                             uVar5._M_t.
                             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                             ._M_head_impl,"# ",2);
                  poVar12 = (ostream *)
                            std::ostream::operator<<
                                      ((ostream *)
                                       uVar5._M_t.
                                       super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                       ._M_head_impl,
                                       ((this->_imp)._M_t.
                                        super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                        .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                       _M_head_impl)->active_level);
                  local_98[0] = 10;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_98,1);
                }
                piVar17 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish;
                piVar14 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                piVar28 = (int *)(ulong)uVar26;
                uVar26 = uVar26 + 1;
                piVar19 = (int *)((long)piVar17 - (long)piVar14 >> 2);
              } while (piVar28 < piVar19);
            }
            uVar26 = (int)local_c0 + 1;
            piVar30 = local_c8;
          } while (local_c8 < piVar19);
        }
        pvVar20 = pvVar20 + 1;
      } while (pvVar20 != local_38);
    }
  }
  local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (long *)0x0;
  local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  pvVar20 = (local_40->
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar23 = (local_40->
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar20 != pvVar23) {
    local_c0 = pvVar23;
    do {
      puVar6 = (ulong *)(pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
      uVar18 = (long)(pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar6;
      if (uVar18 != 4) {
        _Var25._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
        if ((_Var25._M_head_impl)->doing_hom_colour_proof == true) {
          local_b8.
          super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_b8.
          super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_b8.
          super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_c8 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          piVar30 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          if (piVar30 != local_c8) {
            do {
              _Var25._M_head_impl =
                   (this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
              ppVar7 = *(pointer *)((long)&(_Var25._M_head_impl)->p_clique + 8);
              for (__x = *(pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           **)&((_Var25._M_head_impl)->p_clique).
                               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ; __x != ppVar7; __x = __x + 1) {
                _Var25._M_head_impl =
                     (this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
                p_Var15 = *(_Base_ptr *)
                           ((long)&(_Var25._M_head_impl)->t_clique_neighbourhood + 0x10);
                p_Var21 = (_Base_ptr)((long)&(_Var25._M_head_impl)->t_clique_neighbourhood + 8);
                if (p_Var15 != (_Base_ptr)0x0) {
                  iVar4 = *piVar30;
                  p_Var24 = p_Var21;
                  do {
                    if (iVar4 <= (int)p_Var15[1]._M_color) {
                      p_Var24 = p_Var15;
                    }
                    p_Var15 = *(_Base_ptr *)
                               ((long)&p_Var15->_M_left +
                               (ulong)((int)p_Var15[1]._M_color < iVar4) * 8);
                  } while (p_Var15 != (_Base_ptr)0x0);
                  if ((p_Var24 != p_Var21) && ((int)p_Var24[1]._M_color <= iVar4)) {
                    p_Var21 = p_Var24;
                  }
                }
                std::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::
                pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_true>
                          ((pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_98,__x,
                           (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)((long)(p_Var21 + 1) + 8));
                std::
                vector<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::allocator<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>
                ::
                emplace_back<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>
                          ((vector<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>,std::allocator<std::pair<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>>>>
                            *)&local_b8,
                           (pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_98);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_p != &local_58) {
                  operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Stack_90._M_p != &local_80) {
                  operator_delete(_Stack_90._M_p,local_80._M_allocated_capacity + 1);
                }
              }
              piVar30 = piVar30 + 1;
            } while (piVar30 != local_c8);
            _Var25._M_head_impl =
                 (this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)
                     ((_Var25._M_head_impl)->proof_stream)._M_t.
                     super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                     ,"* colour class [",0x10);
          ppVar9 = local_b8.
                   super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (ppVar29 = local_b8.
                         super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; ppVar29 != ppVar9;
              ppVar29 = ppVar29 + 1) {
            uVar5._M_t.
            super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
            .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
            _M_head_impl = (((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->proof_stream)._M_t;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)
                       uVar5._M_t.
                       super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                       ._M_head_impl," ",1);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)
                                 uVar5._M_t.
                                 super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                 ._M_head_impl,(ppVar29->first).second._M_dataplus._M_p,
                                 (ppVar29->first).second._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"/",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,(ppVar29->second).second._M_dataplus._M_p,
                       (ppVar29->second).second._M_string_length);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)
                     (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     proof_stream)._M_t," ]\n",3);
          pvVar23 = local_c0;
          if ((ulong)(((long)local_b8.
                             super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_b8.
                             super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333)
              < 3) {
            if ((long)local_b8.
                      super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_b8.
                      super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start == 0xa0) {
              lVar22 = colour_bound::anon_class_8_1_8991fb9c::operator()
                                 ((anon_class_8_1_8991fb9c *)
                                  (this->_imp)._M_t.
                                  super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                  .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                  _M_head_impl,
                                  local_b8.
                                  super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  local_b8.
                                  super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1);
              local_98 = (undefined1  [8])lVar22;
              if (local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) goto LAB_00150ade;
              std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                        (&local_e8,
                         (iterator)
                         local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long *)local_98);
            }
          }
          else {
            uVar5._M_t.
            super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
            .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
            _M_head_impl = (((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->proof_stream)._M_t;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)
                       uVar5._M_t.
                       super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                       ._M_head_impl,"p ",2);
            colour_bound::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)
                       (this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl,
                       local_b8.
                       super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_b8.
                       super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
            std::ostream::_M_insert<long>
                      ((long)uVar5._M_t.
                             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                             ._M_head_impl);
            if (2 < (ulong)(((long)local_b8.
                                   super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_b8.
                                   super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4) *
                           -0x3333333333333333)) {
              piVar30 = (int *)0x2;
              do {
                uVar5._M_t.
                super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
                _M_head_impl = (((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                _M_head_impl)->proof_stream)._M_t;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)
                           uVar5._M_t.
                           super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                           ._M_head_impl," ",1);
                poVar12 = std::ostream::_M_insert<unsigned_long>
                                    ((ulong)uVar5._M_t.
                                            super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                            ._M_head_impl);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," *",2);
                local_c8 = piVar30;
                if ((int)piVar30 != 0) {
                  lVar22 = 0;
                  do {
                    uVar5._M_t.
                    super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                    ._M_head_impl =
                         (((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         proof_stream)._M_t;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)
                               uVar5._M_t.
                               super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                               ._M_head_impl," ",1);
                    colour_bound::anon_class_8_1_8991fb9c::operator()
                              ((anon_class_8_1_8991fb9c *)
                               (this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                               _M_head_impl,
                               local_b8.
                               super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + (long)piVar30,
                               (pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)((long)&((local_b8.
                                            super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->first).first
                                  + lVar22));
                    poVar12 = std::ostream::_M_insert<long>
                                        ((long)uVar5._M_t.
                                               super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                               .
                                               super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                               ._M_head_impl);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar12," +",2);
                    lVar22 = lVar22 + 0x50;
                  } while ((long)piVar30 * 0x50 != lVar22);
                }
                uVar5._M_t.
                super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
                _M_head_impl = (((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                _M_head_impl)->proof_stream)._M_t;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)
                           uVar5._M_t.
                           super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                           ._M_head_impl," ",1);
                piVar30 = (int *)(ulong)((int)local_c8 + 1);
                poVar12 = std::ostream::_M_insert<unsigned_long>
                                    ((ulong)uVar5._M_t.
                                            super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                            ._M_head_impl);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," d",2);
                piVar19 = (int *)(((long)local_b8.
                                         super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_b8.
                                         super__Vector_base<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                 -0x3333333333333333);
              } while (piVar30 <= piVar19 && (long)piVar19 - (long)piVar30 != 0);
            }
            local_98[0] = 10;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)
                       (((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                       proof_stream)._M_t,(char *)local_98,1);
            pvVar23 = local_c0;
            _Var25._M_head_impl =
                 (this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
            lVar22 = (_Var25._M_head_impl)->proof_line + 1;
            (_Var25._M_head_impl)->proof_line = lVar22;
            if (local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                        ((vector<long,std::allocator<long>> *)&local_e8,
                         (iterator)
                         local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish,&(_Var25._M_head_impl)->proof_line);
            }
            else {
LAB_00150ade:
              *local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish = lVar22;
              local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          std::
          vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~vector(&local_b8);
        }
        else if (uVar18 < 9) {
          if (uVar18 == 8) {
            auVar3._8_8_ = 0;
            auVar3._0_8_ = *puVar6;
            _local_98 = (key_type)vpmovsxdq_avx(auVar3);
            pmVar13 = std::
                      map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
                      ::operator[](&(_Var25._M_head_impl)->non_edge_constraints,(key_type *)local_98
                                  );
            lVar22 = *pmVar13;
            local_98 = (undefined1  [8])lVar22;
            if (local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) goto LAB_00150aa2;
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (&local_e8,
                       (iterator)
                       local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(long *)local_98);
          }
        }
        else {
          uVar5._M_t.
          super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
          .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
          _M_head_impl = ((_Var25._M_head_impl)->proof_stream)._M_t;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)
                     uVar5._M_t.
                     super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                     ._M_head_impl,"p ",2);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)(pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start;
          _local_98 = (key_type)vpmovsxdq_avx(auVar2);
          std::
          map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
          ::operator[](&((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                        non_edge_constraints,(key_type *)local_98);
          std::ostream::_M_insert<long>
                    ((long)uVar5._M_t.
                           super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                           ._M_head_impl);
          if (8 < (ulong)((long)(pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start)) {
            uVar26 = 2;
            uVar18 = 2;
            do {
              uVar5._M_t.
              super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
              .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
              _M_head_impl = (((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                              _M_head_impl)->proof_stream)._M_t;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         uVar5._M_t.
                         super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                         ._M_head_impl," ",1);
              poVar12 = std::ostream::_M_insert<unsigned_long>
                                  ((ulong)uVar5._M_t.
                                          super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                          ._M_head_impl);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," *",2);
              if ((ulong)uVar26 != 0) {
                uVar27 = 0;
                do {
                  uVar5._M_t.
                  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                  ._M_head_impl =
                       (((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                       proof_stream)._M_t;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)
                             uVar5._M_t.
                             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                             ._M_head_impl," ",1);
                  piVar17 = (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start;
                  _Stack_90._M_p = (pointer)(long)piVar17[uVar27];
                  local_98 = (undefined1  [8])(long)piVar17[uVar18];
                  std::
                  map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
                  ::operator[](&((this->_imp)._M_t.
                                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                                _M_head_impl)->non_edge_constraints,(key_type *)local_98);
                  poVar12 = std::ostream::_M_insert<long>
                                      ((long)uVar5._M_t.
                                             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                             ._M_head_impl);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12," +",2);
                  uVar27 = uVar27 + 1;
                } while (uVar26 != uVar27);
              }
              uVar5._M_t.
              super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
              .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
              _M_head_impl = (((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                              _M_head_impl)->proof_stream)._M_t;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         uVar5._M_t.
                         super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                         ._M_head_impl," ",1);
              uVar26 = uVar26 + 1;
              uVar18 = (ulong)uVar26;
              poVar12 = std::ostream::_M_insert<unsigned_long>
                                  ((ulong)uVar5._M_t.
                                          super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                          ._M_head_impl);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12," d",2);
            } while (uVar18 < (ulong)((long)(pvVar20->super__Vector_base<int,_std::allocator<int>_>)
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pvVar20->super__Vector_base<int,_std::allocator<int>_>)
                                            ._M_impl.super__Vector_impl_data._M_start >> 2));
          }
          local_98[0] = 10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)
                     (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     proof_stream)._M_t,(char *)local_98,1);
          pvVar23 = local_c0;
          _Var25._M_head_impl =
               (this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
          lVar22 = (_Var25._M_head_impl)->proof_line + 1;
          (_Var25._M_head_impl)->proof_line = lVar22;
          if (local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      ((vector<long,std::allocator<long>> *)&local_e8,
                       (iterator)
                       local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish,&(_Var25._M_head_impl)->proof_line);
          }
          else {
LAB_00150aa2:
            *local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish = lVar22;
            local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish = local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
        }
        uVar5._M_t.
        super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
        .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
        _M_head_impl = (((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                       proof_stream)._M_t;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   uVar5._M_t.
                   super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                   ._M_head_impl,"p ",2);
        std::ostream::_M_insert<long>
                  ((long)uVar5._M_t.
                         super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                         ._M_head_impl);
        _Var25._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
        if ((_Var25._M_head_impl)->doing_mcs_by_clique == true) {
          for (p_Var16 = *(_Base_ptr *)
                          ((long)&(_Var25._M_head_impl)->at_least_one_value_constraints + 0x18);
              p_Var16 !=
              (_Rb_tree_node_base *)
              ((long)&(_Var25._M_head_impl)->at_least_one_value_constraints + 8U);
              p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
            uVar5._M_t.
            super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
            .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
            _M_head_impl = (((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->proof_stream)._M_t;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)
                       uVar5._M_t.
                       super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                       ._M_head_impl," ",1);
            poVar12 = std::ostream::_M_insert<long>
                                ((long)uVar5._M_t.
                                       super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                       ._M_head_impl);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," +",2);
          }
        }
        plVar8 = local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (plVar31 = local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start; plVar31 != plVar8; plVar31 = plVar31 + 1) {
          uVar5._M_t.
          super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
          .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
          _M_head_impl = (((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                           .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         proof_stream)._M_t;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)
                     uVar5._M_t.
                     super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                     ._M_head_impl," ",1);
          poVar12 = std::ostream::_M_insert<long>
                              ((long)uVar5._M_t.
                                     super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                     ._M_head_impl);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," +",2);
        }
        local_98[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   (((this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                   proof_stream)._M_t,(char *)local_98,1);
        plVar1 = &((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  proof_line;
        *plVar1 = *plVar1 + 1;
      }
      pvVar20 = pvVar20 + 1;
    } while (pvVar20 != pvVar23);
    if (local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

auto Proof::colour_bound(const vector<vector<int>> & ccs) -> void
{
    *_imp->proof_stream << "* bound, ccs";
    for (auto & cc : ccs) {
        *_imp->proof_stream << " [";
        for (auto & c : cc)
            *_imp->proof_stream << " " << c;
        *_imp->proof_stream << " ]";
    }
    *_imp->proof_stream << '\n';

    if (_imp->recover_encoding && ! _imp->doing_hom_colour_proof) {
        for (auto & cc : ccs) {
            if (cc.size() == 1)
                continue;

            for (unsigned i = 0 ; i < cc.size() ; ++i)
                for (unsigned j = i + 1 ; j < cc.size() ; ++j)
                    if (! _imp->non_edge_constraints.contains(pair{cc[i], cc[j]})) {
                        *_imp->proof_stream << "# 0\n";
                        *_imp->proof_stream << "ea -1 x" << _imp->binary_variable_mappings[cc[i]]
                            << " -1 x" << _imp->binary_variable_mappings[cc[j]] << " >= -1 ;\n";
                        auto n = ++_imp->proof_line;
                        _imp->non_edge_constraints[{cc[i], cc[j]}] = n;
                        _imp->non_edge_constraints[{cc[j], cc[i]}] = n;
                        *_imp->proof_stream << "# " << _imp->active_level << '\n';
                    }
        }
    }

    vector<long> to_sum;
    auto do_one_cc = [&](const auto & cc, const auto & non_edge_constraint) {
        if (cc.size() > 2) {
            *_imp->proof_stream << "p " << non_edge_constraint(cc[0], cc[1]);

            for (unsigned i = 2; i < cc.size(); ++i) {
                *_imp->proof_stream << " " << i << " *";
                for (unsigned j = 0; j < i; ++j)
                    *_imp->proof_stream << " " << non_edge_constraint(cc[i], cc[j]) << " +";
                *_imp->proof_stream << " " << (i + 1) << " d";
            }

            *_imp->proof_stream << '\n';
            to_sum.push_back(++_imp->proof_line);
        }
        else if (cc.size() == 2) {
            to_sum.push_back(non_edge_constraint(cc[0], cc[1]));
        }
    };

    for (auto & cc : ccs) {
        if (cc.size() == 1)
            continue;

        if (_imp->doing_hom_colour_proof) {
            vector<pair<NamedVertex, NamedVertex>> bigger_cc;
            for (auto & c : cc)
                for (auto & v : _imp->p_clique)
                    bigger_cc.push_back(pair{v, _imp->t_clique_neighbourhood.find(c)->second});

            *_imp->proof_stream << "* colour class [";
            for (auto & c : bigger_cc)
                *_imp->proof_stream << " " << c.first.second << "/" << c.second.second;
            *_imp->proof_stream << " ]\n";

            do_one_cc(bigger_cc, [&](const pair<NamedVertex, NamedVertex> & a, const pair<NamedVertex, NamedVertex> & b) -> long {
                return _imp->clique_for_hom_non_edge_constraints[pair{a, b}];
            });
        }
        else
            do_one_cc(cc, [&](int a, int b) -> long { return _imp->non_edge_constraints[pair{a, b}]; });

        *_imp->proof_stream << "p " << _imp->objective_line;

        if (_imp->doing_mcs_by_clique) {
            for (auto & [_, v] : _imp->at_least_one_value_constraints) {
                *_imp->proof_stream << " " << get<1>(v) << " +";
            }
        }

        for (auto & t : to_sum)
            *_imp->proof_stream << " " << t << " +";
        *_imp->proof_stream << '\n';
        ++_imp->proof_line;
    }
}